

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dumper.c
# Opt level: O3

void yaml_emitter_delete_document_and_anchors(yaml_emitter_t *emitter)

{
  yaml_node_t *pyVar1;
  yaml_node_type_t yVar2;
  yaml_document_t *pyVar3;
  yaml_char_t *ptr;
  yaml_node_t *pyVar4;
  yaml_node_t *ptr_00;
  long lVar5;
  long lVar6;
  
  pyVar3 = emitter->document;
  if (emitter->anchors == (yaml_anchors_t *)0x0) {
    yaml_document_delete(pyVar3);
  }
  else {
    pyVar4 = (pyVar3->nodes).start;
    ptr_00 = pyVar4;
    if (pyVar4 < (pyVar3->nodes).top) {
      lVar6 = 8;
      lVar5 = 0x60;
      do {
        yVar2 = pyVar4->type;
        ptr = (pyVar4->data).scalar.value;
        if (*(int *)((long)&emitter->anchors->references + lVar6) == 0) {
          yaml_free(pyVar4->tag);
          if (yVar2 - YAML_SCALAR_NODE < 3) goto LAB_001062d0;
        }
        else if ((yVar2 & ~YAML_SCALAR_NODE) == YAML_SEQUENCE_NODE) {
LAB_001062d0:
          yaml_free(ptr);
        }
        ptr_00 = (emitter->document->nodes).start;
        pyVar4 = (yaml_node_t *)((long)&ptr_00->type + lVar5);
        lVar6 = lVar6 + 0xc;
        pyVar1 = (yaml_node_t *)((long)&ptr_00->type + lVar5);
        lVar5 = lVar5 + 0x60;
      } while (pyVar1 < (emitter->document->nodes).top);
    }
    yaml_free(ptr_00);
    pyVar3 = emitter->document;
    (pyVar3->nodes).top = (yaml_node_t *)0x0;
    (pyVar3->nodes).start = (yaml_node_t *)0x0;
    (pyVar3->nodes).end = (yaml_node_t *)0x0;
    yaml_free(emitter->anchors);
    emitter->anchors = (yaml_anchors_t *)0x0;
    emitter->last_anchor_id = 0;
  }
  emitter->document = (yaml_document_t *)0x0;
  return;
}

Assistant:

static void
yaml_emitter_delete_document_and_anchors(yaml_emitter_t *emitter)
{
    int index;

    if (!emitter->anchors) {
        yaml_document_delete(emitter->document);
        emitter->document = NULL;
        return;
    }

    for (index = 0; emitter->document->nodes.start + index
            < emitter->document->nodes.top; index ++) {
        yaml_node_t node = emitter->document->nodes.start[index];
        if (!emitter->anchors[index].serialized) {
            yaml_free(node.tag);
            if (node.type == YAML_SCALAR_NODE) {
                yaml_free(node.data.scalar.value);
            }
        }
        if (node.type == YAML_SEQUENCE_NODE) {
            STACK_DEL(emitter, node.data.sequence.items);
        }
        if (node.type == YAML_MAPPING_NODE) {
            STACK_DEL(emitter, node.data.mapping.pairs);
        }
    }

    STACK_DEL(emitter, emitter->document->nodes);
    yaml_free(emitter->anchors);

    emitter->anchors = NULL;
    emitter->last_anchor_id = 0;
    emitter->document = NULL;
}